

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

cali_id_t __thiscall cali::Entry::attribute(Entry *this)

{
  Entry *local_30;
  cali_id_t node_attr_id;
  Entry *this_local;
  
  if (this->m_node == (Node *)0x0) {
    this_local = (Entry *)0xffffffffffffffff;
  }
  else {
    local_30 = (Entry *)Node::attribute(this->m_node);
    if (local_30 == (Entry *)0x8) {
      local_30 = (Entry *)Node::id(this->m_node);
    }
    this_local = local_30;
  }
  return (cali_id_t)this_local;
}

Assistant:

cali_id_t attribute() const
    {
        if (m_node) {
            cali_id_t node_attr_id = m_node->attribute();
            return node_attr_id == Attribute::NAME_ATTR_ID ? m_node->id() : node_attr_id;
        }
        return CALI_INV_ID;
    }